

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::StructUnionTypeSyntax::setChild
          (StructUnionTypeSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 in_RDX;
  
  (*(code *)(&DAT_00483fe8 + *(int *)(&DAT_00483fe8 + index * 4)))
            (&child,index,in_RDX,&DAT_00483fe8 + *(int *)(&DAT_00483fe8 + index * 4));
  return;
}

Assistant:

void StructUnionTypeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: taggedOrSoft = child.token(); return;
        case 2: packed = child.token(); return;
        case 3: signing = child.token(); return;
        case 4: openBrace = child.token(); return;
        case 5: members = child.node()->as<SyntaxList<StructUnionMemberSyntax>>(); return;
        case 6: closeBrace = child.token(); return;
        case 7: dimensions = child.node()->as<SyntaxList<VariableDimensionSyntax>>(); return;
        default: SLANG_UNREACHABLE;
    }
}